

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_0::ConnectHttpService::ConnectHttpService
          (ConnectHttpService *this,HttpHeaderTable *table)

{
  Settings local_58;
  
  (this->super_HttpService)._vptr_HttpService = (_func_int **)&PTR_request_00617b90;
  TimerImpl::TimerImpl(&this->timer,(TimePoint)0x0);
  (this->tunneledService).super_HttpService._vptr_HttpService = (_func_int **)&PTR_request_00617bc8;
  (this->tunneledService).table = table;
  local_58._60_4_ = 0;
  local_58.headerTimeout.value = 15000000000;
  local_58.pipelineTimeout.value = 5000000000;
  local_58.canceledUploadGracePeriod.value = 1000000000;
  local_58.canceledUploadGraceBytes = 0x10000;
  local_58.errorHandler.ptr = (HttpServerErrorHandler *)0x0;
  local_58.callbacks.ptr._0_4_ = 0;
  local_58.callbacks.ptr._4_4_ = 0;
  local_58.webSocketErrorHandler.ptr._0_4_ = 0;
  local_58.webSocketErrorHandler.ptr._4_4_ = 0;
  local_58.webSocketCompressionMode = NO_COMPRESSION;
  HttpServer::HttpServer
            (&this->server,&(this->timer).super_Timer,table,
             &(this->tunneledService).super_HttpService,&local_58);
  return;
}

Assistant:

ConnectHttpService(HttpHeaderTable& table)
      : timer(kj::origin<kj::TimePoint>()),
        tunneledService(table),
        server(timer, table, tunneledService) {}